

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O3

void EPD_DrawEllipse(uint16_t Xpos,uint16_t Ypos,uint16_t XRadius,uint16_t YRadius,uint8_t color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined6 in_register_0000000a;
  int iVar5;
  undefined6 in_register_00000012;
  uint16_t uVar6;
  uint16_t uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  
  iVar5 = (int)CONCAT62(in_register_00000012,XRadius);
  iVar2 = iVar5 * -2 + 2;
  iVar3 = (int)CONCAT62(in_register_0000000a,YRadius);
  iVar4 = -iVar3;
  iVar8 = 0;
  uVar6 = gstI80DevInfo.usPanelW;
  uVar7 = gstI80DevInfo.usPanelH;
  do {
    iVar12 = (int)((float)iVar8 / ((float)iVar3 / (float)iVar5));
    uVar11 = (uint)Xpos - iVar12;
    uVar10 = iVar4 + (uint)Ypos;
    if (((ushort)uVar11 < uVar6) && ((ushort)uVar10 < uVar7)) {
      gpFrameBuf[(ulong)(uVar11 & 0xffff) + (ulong)uVar6 * ((ulong)uVar10 & 0xffff)] = color;
      uVar6 = gstI80DevInfo.usPanelW;
      uVar7 = gstI80DevInfo.usPanelH;
    }
    uVar13 = iVar12 + (uint)Xpos;
    if (((ushort)uVar13 < uVar6) && ((ushort)uVar10 < uVar7)) {
      gpFrameBuf[(ulong)(uVar13 & 0xffff) + (ulong)uVar6 * ((ulong)uVar10 & 0xffff)] = color;
      uVar6 = gstI80DevInfo.usPanelW;
      uVar7 = gstI80DevInfo.usPanelH;
    }
    uVar10 = (uint)Ypos - iVar4;
    if (((ushort)uVar13 < uVar6) && ((ushort)uVar10 < uVar7)) {
      gpFrameBuf[(ulong)(uVar13 & 0xffff) + (ulong)uVar6 * (ulong)(uVar10 & 0xffff)] = color;
      uVar6 = gstI80DevInfo.usPanelW;
      uVar7 = gstI80DevInfo.usPanelH;
    }
    if (((ushort)uVar11 < uVar6) && ((ushort)uVar10 < uVar7)) {
      gpFrameBuf[(ulong)(uVar11 & 0xffff) + (ulong)uVar6 * (ulong)(uVar10 & 0xffff)] = color;
      uVar6 = gstI80DevInfo.usPanelW;
      uVar7 = gstI80DevInfo.usPanelH;
    }
    iVar12 = iVar2;
    if (iVar2 <= iVar8) {
      iVar9 = iVar8 + 1;
      iVar12 = iVar2 + iVar8 * 2 + 3;
      iVar8 = iVar9;
      if ((iVar9 + iVar4 == 0) && (iVar2 <= iVar4)) {
        iVar2 = 0;
      }
    }
    iVar1 = iVar4 + 1;
    iVar9 = iVar4 * 2 + 3;
    if (iVar2 <= iVar4) {
      iVar1 = iVar4;
      iVar9 = 0;
    }
    iVar4 = iVar1;
    iVar2 = iVar9 + iVar12;
  } while (iVar4 < 1);
  return;
}

Assistant:

void EPD_DrawEllipse(uint16_t Xpos, uint16_t Ypos, uint16_t XRadius, uint16_t YRadius, uint8_t color)
{
  int32_t x = 0, y = -YRadius, err = 2-2*XRadius, e2;
  float k = 0, rad1 = 0, rad2 = 0;
  
  rad1 = XRadius;
  rad2 = YRadius;
  
  k = (float)(rad2/rad1);  
  
  do { 
    EPD_DrawPixel((Xpos-(uint16_t)(x/k)), (Ypos+y), color);
    EPD_DrawPixel((Xpos+(uint16_t)(x/k)), (Ypos+y), color);
    EPD_DrawPixel((Xpos+(uint16_t)(x/k)), (Ypos-y), color);
    EPD_DrawPixel((Xpos-(uint16_t)(x/k)), (Ypos-y), color);      
    
    e2 = err;
    if (e2 <= x) {
      err += ++x*2+1;
      if (-y == x && e2 <= y) e2 = 0;
    }
    if (e2 > y) err += ++y*2+1;     
  }
  while (y <= 0);
}